

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

AActor * SpawnMapThing(int index,FMapThing *mt,int position)

{
  double dVar1;
  double dVar2;
  double dVar3;
  short sVar4;
  uint uVar5;
  AActor *ac;
  PClass *pPVar6;
  char *pcVar7;
  
  ac = P_SpawnMapThing(mt,position);
  if (dumpspawnedthings.Value == true) {
    dVar1 = (mt->pos).X;
    dVar2 = (mt->pos).Y;
    dVar3 = (mt->pos).Z;
    sVar4 = mt->EdNum;
    uVar5 = mt->flags;
    if (ac == (AActor *)0x0) {
      pcVar7 = "(none)";
    }
    else {
      pPVar6 = DObject::GetClass((DObject *)ac);
      pcVar7 = FName::NameData.NameArray
               [(pPVar6->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text;
    }
    Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",dVar1,dVar2,dVar3,
           index,(ulong)(uint)(int)sVar4,(ulong)uVar5,pcVar7);
  }
  T_AddSpawnedThing(ac);
  return ac;
}

Assistant:

AActor *SpawnMapThing(int index, FMapThing *mt, int position)
{
	AActor *spawned = P_SpawnMapThing(mt, position);
	if (dumpspawnedthings)
	{
		Printf("%5d: (%5f, %5f, %5f), doomednum = %5d, flags = %04x, type = %s\n",
			index, mt->pos.X, mt->pos.Y, mt->pos.Z, mt->EdNum, mt->flags, 
			spawned? spawned->GetClass()->TypeName.GetChars() : "(none)");
	}
	T_AddSpawnedThing(spawned);
	return spawned;
}